

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineOption.cpp
# Opt level: O0

EngineOption * __thiscall
senjo::EngineOption::GetTypeName_abi_cxx11_(EngineOption *this,OptionType type)

{
  undefined *puVar1;
  undefined *puVar2;
  undefined *puVar3;
  undefined *puVar4;
  char *pcVar5;
  undefined *puVar6;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  OptionType local_14;
  EngineOption *pEStack_10;
  OptionType type_local;
  
  puVar6 = OPT_UNKNOWN_NAME;
  pcVar5 = OPT_STRING_NAME;
  puVar4 = OPT_SPIN_NAME;
  puVar3 = OPT_COMBO_NAME;
  puVar2 = OPT_CHECK_NAME;
  puVar1 = OPT_BUTTON_NAME;
  local_14 = type;
  pEStack_10 = this;
  switch(type) {
  case Button:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,puVar1,&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case Checkbox:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,puVar2,local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case ComboBox:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,puVar3,&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case Spin:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,puVar4,&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case String:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,pcVar5,&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,puVar6,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return this;
}

Assistant:

std::string EngineOption::GetTypeName(const EngineOption::OptionType type)
{
  switch (type) {
  case OptionType::Button:   return OPT_BUTTON_NAME;
  case OptionType::Checkbox: return OPT_CHECK_NAME;
  case OptionType::ComboBox: return OPT_COMBO_NAME;
  case OptionType::Spin:     return OPT_SPIN_NAME;
  case OptionType::String:   return OPT_STRING_NAME;
  default:
    break;
  }
  return OPT_UNKNOWN_NAME;
}